

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agc.c
# Opt level: O0

int32_t WebRtcAgc_ProcessDigital
                  (DigitalAgc *stt,int16_t **in_near,size_t num_bands,int16_t **out,uint32_t FS,
                  int16_t lowlevelSignal)

{
  int iVar1;
  int16_t iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  byte bVar6;
  int aiStack_20098 [32750];
  int64_t tmp64;
  int32_t nrg;
  int16_t L2;
  size_t L;
  size_t i;
  size_t n;
  short local_b8;
  short local_b6;
  int16_t k;
  int16_t gain_adj;
  int16_t gate;
  int16_t decay;
  int16_t frac;
  int16_t zeros_fast;
  int16_t zeros;
  int16_t upper_thr;
  int16_t lower_thr;
  int16_t logratio;
  int32_t delta;
  int32_t gain32;
  int32_t cur_level;
  int32_t max_nrg;
  int32_t env [10];
  int32_t tmp32;
  int32_t out_tmp;
  int32_t gains [11];
  int16_t lowlevelSignal_local;
  uint32_t FS_local;
  int16_t **out_local;
  size_t num_bands_local;
  int16_t **in_near_local;
  DigitalAgc *stt_local;
  
  gate = 0;
  k = 0;
  if (FS == 8000) {
    _nrg = 8;
    tmp64._6_1_ = '\x03';
  }
  else {
    if (((FS != 16000) && (FS != 32000)) && (FS != 48000)) {
      return -1;
    }
    _nrg = 0x10;
    tmp64._6_1_ = '\x04';
  }
  gains[10]._2_2_ = lowlevelSignal;
  for (L = 0; L < num_bands; L = L + 1) {
    if (in_near[L] != out[L]) {
      memcpy(out[L],in_near[L],_nrg * 0x14);
    }
  }
  zeros_fast = WebRtcAgc_ProcessVad(&stt->vadNearend,*out,_nrg * 10);
  if (10 < (stt->vadFarend).counter) {
    env[8] = zeros_fast * 3;
    zeros_fast = (int16_t)(zeros_fast * 3 - (int)(stt->vadFarend).logRatio >> 2);
  }
  if (zeros_fast < 0x401) {
    if (zeros_fast < 0) {
      local_b6 = 0;
    }
    else {
      env[8] = zeros_fast * -0x41;
      local_b6 = (short)(zeros_fast * -0x41 >> 10);
    }
  }
  else {
    local_b6 = -0x41;
  }
  if (stt->agcMode != 3) {
    if ((stt->vadNearend).stdLongTerm < 4000) {
      local_b6 = 0;
    }
    else if ((stt->vadNearend).stdLongTerm < 0x1fa0) {
      env[8] = ((stt->vadNearend).stdLongTerm + -4000) * (int)local_b6;
      local_b6 = (short)(env[8] >> 0xc);
    }
    if (gains[10]._2_2_ != 0) {
      local_b6 = 0;
    }
  }
  for (n._4_2_ = 0; n._4_2_ < 10; n._4_2_ = n._4_2_ + 1) {
    gain32 = 0;
    for (i = 0; i < _nrg; i = i + 1) {
      if (gain32 < (int)(*out)[(long)n._4_2_ * _nrg + i] * (int)(*out)[(long)n._4_2_ * _nrg + i]) {
        gain32 = (int)(*out)[(long)n._4_2_ * _nrg + i] * (int)(*out)[(long)n._4_2_ * _nrg + i];
      }
    }
    (&cur_level)[n._4_2_] = gain32;
  }
  tmp32 = stt->gain;
  for (n._4_2_ = 0; n._4_2_ < 10; n._4_2_ = n._4_2_ + 1) {
    stt->capacitorFast =
         stt->capacitorFast + (stt->capacitorFast >> 0x10) * -1000 +
         ((int)((stt->capacitorFast & 0xffffU) * -1000) >> 0x10);
    if (stt->capacitorFast < (&cur_level)[n._4_2_]) {
      stt->capacitorFast = (&cur_level)[n._4_2_];
    }
    if (stt->capacitorSlow < (&cur_level)[n._4_2_]) {
      stt->capacitorSlow =
           stt->capacitorSlow + ((&cur_level)[n._4_2_] - stt->capacitorSlow >> 0x10) * 500 +
           ((int)(((&cur_level)[n._4_2_] - stt->capacitorSlow & 0xffffU) * 500) >> 0x10);
    }
    else {
      stt->capacitorSlow =
           stt->capacitorSlow + (stt->capacitorSlow >> 0x10) * (int)local_b6 +
           ((int)((stt->capacitorSlow & 0xffffU) * (int)local_b6) >> 0x10);
    }
    if (stt->capacitorSlow < stt->capacitorFast) {
      delta = stt->capacitorFast;
    }
    else {
      delta = stt->capacitorSlow;
    }
    gate = NormU32(delta);
    if (delta == 0) {
      gate = 0x1f;
    }
    k = (short)((ushort)((uint)(delta << ((byte)gate & 0x1f)) >> 0x10) & 0x7fff) >> 3;
    env[8] = (stt->gainTable[gate + -1] - stt->gainTable[gate]) * (int)k;
    (&tmp32)[n._4_2_ + 1] = stt->gainTable[gate] + (env[8] >> 0xc);
  }
  gain_adj = NormU32(stt->capacitorFast);
  if (stt->capacitorFast == 0) {
    gain_adj = 0x1f;
  }
  env[8] = stt->capacitorFast << ((byte)gain_adj & 0x1f) & 0x7fffffff;
  local_b8 = (((gain_adj * 0x200 - (short)(env[8] >> 0x16)) + 1000) - (gate * 0x200 - (k >> 3))) -
             (stt->vadNearend).stdShortTerm;
  if (local_b8 < 0) {
    stt->gatePrevious = 0;
  }
  else {
    env[8] = stt->gatePrevious * 7;
    local_b8 = (short)(local_b8 + env[8] >> 3);
    stt->gatePrevious = local_b8;
  }
  if (0 < local_b8) {
    if (local_b8 < 0x9c4) {
      n._6_2_ = (short)(0x9c4 - local_b8 >> 5);
    }
    else {
      n._6_2_ = 0;
    }
    for (n._4_2_ = 0; n._4_2_ < 10; n._4_2_ = n._4_2_ + 1) {
      if ((&tmp32)[n._4_2_ + 1] - stt->gainTable[0] < 0x800001) {
        env[8] = ((&tmp32)[n._4_2_ + 1] - stt->gainTable[0]) * (n._6_2_ + 0xb2) >> 8;
      }
      else {
        env[8] = (n._6_2_ + 0xb2) * ((&tmp32)[n._4_2_ + 1] - stt->gainTable[0] >> 8);
      }
      (&tmp32)[n._4_2_ + 1] = stt->gainTable[0] + env[8];
    }
  }
  for (n._4_2_ = 0; n._4_2_ < 10; n._4_2_ = n._4_2_ + 1) {
    gate = 10;
    if (0x2d413cc < (&tmp32)[n._4_2_ + 1]) {
      iVar2 = NormW32((&tmp32)[n._4_2_ + 1]);
      gate = 0x10 - iVar2;
    }
    bVar6 = (byte)gate;
    iVar3 = ((&tmp32)[n._4_2_ + 1] >> (bVar6 & 0x1f)) + 1;
    _lower_thr = iVar3 * iVar3;
    while( true ) {
      if ((0xb - gate) * 2 < 0) {
        aiStack_20098[0x7fea] = 0x7fff >> (('\v' - bVar6) * -2 & 0x1f);
      }
      else {
        aiStack_20098[0x7fea] = (1 << (('\v' - bVar6) * '\x02' & 0x1f)) * 0x7fff;
      }
      if (((int)_lower_thr >> 0xd) * (((&cur_level)[n._4_2_] >> 0xc) + 1) +
          ((int)((_lower_thr & 0x1fff) * (((&cur_level)[n._4_2_] >> 0xc) + 1)) >> 0xd) <=
          aiStack_20098[0x7fea]) break;
      if ((&tmp32)[n._4_2_ + 1] < 0x800000) {
        (&tmp32)[n._4_2_ + 1] = ((&tmp32)[n._4_2_ + 1] * 0xfd) / 0x100;
      }
      else {
        (&tmp32)[n._4_2_ + 1] = ((&tmp32)[n._4_2_ + 1] / 0x100) * 0xfd;
      }
      iVar3 = ((&tmp32)[n._4_2_ + 1] >> (bVar6 & 0x1f)) + 1;
      _lower_thr = iVar3 * iVar3;
    }
  }
  for (n._4_2_ = 1; n._4_2_ < 10; n._4_2_ = n._4_2_ + 1) {
    if ((&tmp32)[n._4_2_ + 1] < (&tmp32)[n._4_2_]) {
      (&tmp32)[n._4_2_] = (&tmp32)[n._4_2_ + 1];
    }
  }
  stt->gain = gains[8];
  _lower_thr = tmp32 << 4;
  for (i = 0; i < _nrg; i = i + 1) {
    for (L = 0; L < num_bands; L = L + 1) {
      env[8] = (int)out[L][i] * ((int)(_lower_thr + 0x7f) >> 7);
      env[9] = env[8] >> 0x10;
      if (env[9] < 0x1000) {
        if (env[9] < -0x1000) {
          out[L][i] = -0x8000;
        }
        else {
          env[8] = (int)out[L][i] * ((int)_lower_thr >> 4);
          out[L][i] = (int16_t)((uint)env[8] >> 0x10);
        }
      }
      else {
        out[L][i] = 0x7fff;
      }
    }
    _lower_thr = (out_tmp - tmp32) * (1 << (4U - tmp64._6_1_ & 0x1f)) + _lower_thr;
  }
  for (n._4_2_ = 1; n._4_2_ < 10; n._4_2_ = n._4_2_ + 1) {
    iVar3 = (&tmp32)[n._4_2_ + 1];
    iVar1 = (&tmp32)[n._4_2_];
    _lower_thr = (&tmp32)[n._4_2_] << 4;
    for (i = 0; i < _nrg; i = i + 1) {
      for (L = 0; L < num_bands; L = L + 1) {
        lVar4 = (long)out[L][(long)n._4_2_ * _nrg + i] * (long)((int)_lower_thr >> 4);
        lVar5 = lVar4 >> 0x10;
        if (lVar5 < 0x8000) {
          if (lVar5 < -0x8000) {
            out[L][(long)n._4_2_ * _nrg + i] = -0x8000;
          }
          else {
            out[L][(long)n._4_2_ * _nrg + i] = (int16_t)((ulong)lVar4 >> 0x10);
          }
        }
        else {
          out[L][(long)n._4_2_ * _nrg + i] = 0x7fff;
        }
      }
      _lower_thr = (iVar3 - iVar1) * (1 << (4U - tmp64._6_1_ & 0x1f)) + _lower_thr;
    }
  }
  return 0;
}

Assistant:

int32_t WebRtcAgc_ProcessDigital(DigitalAgc *stt, const int16_t *const *in_near, size_t num_bands, int16_t *const *out,
                                 uint32_t FS, int16_t lowlevelSignal) {
    // array for gains (one value per ms, incl start & end)
    int32_t gains[11];

    int32_t out_tmp, tmp32;
    int32_t env[10];
    int32_t max_nrg;
    int32_t cur_level;
    int32_t gain32, delta;
    int16_t logratio;
    int16_t lower_thr, upper_thr;
    int16_t zeros = 0, zeros_fast, frac = 0;
    int16_t decay;
    int16_t gate, gain_adj;
    int16_t k;
    size_t n, i, L;
    int16_t L2;  // samples/subframe

    // determine number of samples per ms
    if (FS == 8000) {
        L = 8;
        L2 = 3;
    } else if (FS == 16000 || FS == 32000 || FS == 48000) {
        L = 16;
        L2 = 4;
    } else {
        return -1;
    }

    for (i = 0; i < num_bands; ++i) {
        if (in_near[i] != out[i]) {
            // Only needed if they don't already point to the same place.
            memcpy(out[i], in_near[i], 10 * L * sizeof(in_near[i][0]));
        }
    }
    // VAD for near end
    logratio = WebRtcAgc_ProcessVad(&stt->vadNearend, out[0], L * 10);

    // Account for far end VAD
    if (stt->vadFarend.counter > 10) {
        tmp32 = 3 * logratio;
        logratio = (int16_t) ((tmp32 - stt->vadFarend.logRatio) >> 2);
    }

    // Determine decay factor depending on VAD
    //  upper_thr = 1.0f;
    //  lower_thr = 0.25f;
    upper_thr = 1024;  // Q10
    lower_thr = 0;     // Q10
    if (logratio > upper_thr) {
        // decay = -2^17 / DecayTime;  ->  -65
        decay = -65;
    } else if (logratio < lower_thr) {
        decay = 0;
    } else {
        // decay = (int16_t)(((lower_thr - logratio)
        //       * (2^27/(DecayTime*(upper_thr-lower_thr)))) >> 10);
        // SUBSTITUTED: 2^27/(DecayTime*(upper_thr-lower_thr))  ->  65
        tmp32 = (lower_thr - logratio) * 65;
        decay = (int16_t) (tmp32 >> 10);
    }

    // adjust decay factor for long silence (detected as low standard deviation)
    // This is only done in the adaptive modes
    if (stt->agcMode != kAgcModeFixedDigital) {
        if (stt->vadNearend.stdLongTerm < 4000) {
            decay = 0;
        } else if (stt->vadNearend.stdLongTerm < 8096) {
            // decay = (int16_t)(((stt->vadNearend.stdLongTerm - 4000) * decay) >>
            // 12);
            tmp32 = (stt->vadNearend.stdLongTerm - 4000) * decay;
            decay = (int16_t) (tmp32 >> 12);
        }

        if (lowlevelSignal != 0) {
            decay = 0;
        }
    }
#ifdef WEBRTC_AGC_DEBUG_DUMP
    stt->frameCounter++;
    fprintf(stt->logFile, "%5.2f\t%d\t%d\t%d\t", (float)(stt->frameCounter) / 100, logratio, decay,
            stt->vadNearend.stdLongTerm);
#endif
    // Find max amplitude per sub frame
    // iterate over sub frames
    for (k = 0; k < 10; k++) {
        // iterate over samples
        max_nrg = 0;
        for (n = 0; n < L; n++) {
            int32_t nrg = out[0][k * L + n] * out[0][k * L + n];
            if (nrg > max_nrg) {
                max_nrg = nrg;
            }
        }
        env[k] = max_nrg;
    }

    // Calculate gain per sub frame
    gains[0] = stt->gain;
    for (k = 0; k < 10; k++) {
        // Fast envelope follower
        //  decay time = -131000 / -1000 = 131 (ms)
        stt->capacitorFast = AGC_SCALEDIFF32(-1000, stt->capacitorFast, stt->capacitorFast);
        if (env[k] > stt->capacitorFast) {
            stt->capacitorFast = env[k];
        }
        // Slow envelope follower
        if (env[k] > stt->capacitorSlow) {
            // increase capacitorSlow
            stt->capacitorSlow = AGC_SCALEDIFF32(500, (env[k] - stt->capacitorSlow), stt->capacitorSlow);
        } else {
            // decrease capacitorSlow
            stt->capacitorSlow = AGC_SCALEDIFF32(decay, stt->capacitorSlow, stt->capacitorSlow);
        }

        // use maximum of both capacitors as current level
        if (stt->capacitorFast > stt->capacitorSlow) {
            cur_level = stt->capacitorFast;
        } else {
            cur_level = stt->capacitorSlow;
        }
        // Translate signal level into gain, using a piecewise linear approximation
        // find number of leading zeros
        zeros = NormU32((uint32_t) cur_level);
        if (cur_level == 0) {
            zeros = 31;
        }
        tmp32 = ((uint32_t) cur_level << zeros) & 0x7FFFFFFF;
        frac = (int16_t) (tmp32 >> 19);  // Q12.
        tmp32 = (stt->gainTable[zeros - 1] - stt->gainTable[zeros]) * frac;
        gains[k + 1] = stt->gainTable[zeros] + (tmp32 >> 12);
#ifdef WEBRTC_AGC_DEBUG_DUMP
        if (k == 0) {
            fprintf(stt->logFile, "%d\t%d\t%d\t%d\t%d\n", env[0], cur_level, stt->capacitorFast, stt->capacitorSlow,
                    zeros);
        }
#endif
    }

    // Gate processing (lower gain during absence of speech)
    zeros = (zeros << 9) - (frac >> 3);
    // find number of leading zeros
    zeros_fast = NormU32((uint32_t) stt->capacitorFast);
    if (stt->capacitorFast == 0) {
        zeros_fast = 31;
    }
    tmp32 = ((uint32_t) stt->capacitorFast << zeros_fast) & 0x7FFFFFFF;
    zeros_fast <<= 9;
    zeros_fast -= (int16_t) (tmp32 >> 22);

    gate = 1000 + zeros_fast - zeros - stt->vadNearend.stdShortTerm;

    if (gate < 0) {
        stt->gatePrevious = 0;
    } else {
        tmp32 = stt->gatePrevious * 7;
        gate = (int16_t) ((gate + tmp32) >> 3);
        stt->gatePrevious = gate;
    }
    // gate < 0     -> no gate
    // gate > 2500  -> max gate
    if (gate > 0) {
        if (gate < 2500) {
            gain_adj = (2500 - gate) >> 5;
        } else {
            gain_adj = 0;
        }
        for (k = 0; k < 10; k++) {
            if ((gains[k + 1] - stt->gainTable[0]) > 8388608) {
                // To prevent wraparound
                tmp32 = (gains[k + 1] - stt->gainTable[0]) >> 8;
                tmp32 *= 178 + gain_adj;
            } else {
                tmp32 = (gains[k + 1] - stt->gainTable[0]) * (178 + gain_adj);
                tmp32 >>= 8;
            }
            gains[k + 1] = stt->gainTable[0] + tmp32;
        }
    }

    // Limit gain to avoid overload distortion
    for (k = 0; k < 10; k++) {
        // To prevent wrap around
        zeros = 10;
        if (gains[k + 1] > 47453132) {
            zeros = 16 - NormW32(gains[k + 1]);
        }
        gain32 = (gains[k + 1] >> zeros) + 1;
        gain32 *= gain32;
        // check for overflow
        while (AGC_MUL32((env[k] >> 12) + 1, gain32) > SHIFT_W32((int32_t) 32767, 2 * (1 - zeros + 10))) {
            // multiply by 253/256 ==> -0.1 dB
            if (gains[k + 1] > 8388607) {
                // Prevent wrap around
                gains[k + 1] = (gains[k + 1] / 256) * 253;
            } else {
                gains[k + 1] = (gains[k + 1] * 253) / 256;
            }
            gain32 = (gains[k + 1] >> zeros) + 1;
            gain32 *= gain32;
        }
    }
    // gain reductions should be done 1 ms earlier than gain increases
    for (k = 1; k < 10; k++) {
        if (gains[k] > gains[k + 1]) {
            gains[k] = gains[k + 1];
        }
    }
    // save start gain for next frame
    stt->gain = gains[10];

    // Apply gain
    // handle first sub frame separately
    delta = (gains[1] - gains[0]) * (1 << (4 - L2));
    gain32 = gains[0] * (1 << 4);
    // iterate over samples
    for (n = 0; n < L; n++) {
        for (i = 0; i < num_bands; ++i) {
            tmp32 = out[i][n] * ((gain32 + 127) >> 7);
            out_tmp = tmp32 >> 16;
            if (out_tmp > 4095) {
                out[i][n] = (int16_t) 32767;
            } else if (out_tmp < -4096) {
                out[i][n] = (int16_t) -32768;
            } else {
                tmp32 = out[i][n] * (gain32 >> 4);
                out[i][n] = (int16_t) (tmp32 >> 16);
            }
        }
        //

        gain32 += delta;
    }
    // iterate over subframes
    for (k = 1; k < 10; k++) {
        delta = (gains[k + 1] - gains[k]) * (1 << (4 - L2));
        gain32 = gains[k] * (1 << 4);
        // iterate over samples
        for (n = 0; n < L; n++) {
            for (i = 0; i < num_bands; ++i) {
                int64_t tmp64 = ((int64_t) (out[i][k * L + n])) * (gain32 >> 4);
                tmp64 = tmp64 >> 16;
                if (tmp64 > 32767) {
                    out[i][k * L + n] = 32767;
                } else if (tmp64 < -32768) {
                    out[i][k * L + n] = -32768;
                } else {
                    out[i][k * L + n] = (int16_t) (tmp64);
                }
            }
            gain32 += delta;
        }
    }

    return 0;
}